

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O0

Unique<Type>_conflict7 __thiscall
anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>::load
          (Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *this,Model *model,Json *source)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  const_reference pvVar1;
  Interval IVar2;
  allocator<char> local_b9;
  key_type local_b8;
  undefined1 local_98 [8];
  Interval domain;
  allocator<char> local_71;
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  Ref<anurbs::NurbsCurveGeometry<3L>_> geometry;
  Json *source_local;
  Model *model_local;
  
  geometry.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)source;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"geometry",&local_71);
  pvVar1 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(source,&local_70);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_50,pvVar1);
  Model::get_lazy<anurbs::NurbsCurveGeometry<3l>>((Model *)local_30,(string *)model);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  this_00 = geometry.m_entry.
            super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"domain",&local_b9);
  pvVar1 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)this_00._M_pi,&local_b8);
  IVar2 = nlohmann::
          basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator_Interval<anurbs::Interval,_0>(pvVar1);
  domain.m_t0 = IVar2.m_t1;
  local_98 = (undefined1  [8])IVar2.m_t0;
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  new_<anurbs::Curve<3l,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>const&,anurbs::Interval_const&>
            ((anurbs *)this,(Ref<anurbs::NurbsCurveGeometry<3L>_> *)local_30,(Interval *)local_98);
  Ref<anurbs::NurbsCurveGeometry<3L>_>::~Ref((Ref<anurbs::NurbsCurveGeometry<3L>_> *)local_30);
  return (__uniq_ptr_data<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_std::default_delete<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_std::default_delete<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Type> load(Model& model, const Json& source)
    {
        const auto geometry = model.get_lazy<NurbsCurveGeometry<TDimension>>(
            source.at("geometry"));

        const Interval domain = source.at("domain");

        return new_<Type>(geometry, domain);
    }